

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl_io.cpp
# Opt level: O0

void __thiscall OPLio::OPLwriteFreq(OPLio *this,uint channel,uint note,uint pitch,uint keyon)

{
  WORD WVar1;
  int local_28;
  int i;
  int j;
  int octave;
  uint keyon_local;
  uint pitch_local;
  uint note_local;
  uint channel_local;
  OPLio *this_local;
  
  i = 0;
  local_28 = note * 0x20 + pitch;
  if (local_28 < 0) {
    local_28 = 0;
  }
  else if (0x11b < local_28) {
    i = (local_28 + -0x11c) / 0x180;
    if (7 < i) {
      i = 7;
    }
    local_28 = (local_28 + -0x11c) % 0x180 + 0x11c;
  }
  WVar1 = frequencies[local_28];
  OPLwriteValue(this,0xa0,channel,(uchar)WVar1);
  OPLwriteValue(this,0xb0,channel,
                (byte)(WVar1 >> 8) | (byte)((uint)(i << 10) >> 8) | (byte)(keyon << 5));
  return;
}

Assistant:

void OPLio::OPLwriteFreq(uint channel, uint note, uint pitch, uint keyon)
{
	int octave = 0;
	int j = (note << 5) + pitch;

	if (j < 0)
	{
		j = 0;
	}
	else if (j >= 284)
	{
		j -= 284;
		octave = j / (32*12);
		if (octave > 7)
		{
			octave = 7;
		}
		j = (j % (32*12)) + 284;
	}
	int i = frequencies[j] | (octave << 10);

	OPLwriteValue (0xA0, channel, (BYTE)i);
	OPLwriteValue (0xB0, channel, (BYTE)(i>>8)|(keyon<<5));
}